

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

SimpleRecurrentLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::SimpleRecurrentLayerParams>
          (Arena *arena)

{
  SimpleRecurrentLayerParams *this;
  
  if (arena == (Arena *)0x0) {
    this = (SimpleRecurrentLayerParams *)operator_new(0x48);
    CoreML::Specification::SimpleRecurrentLayerParams::SimpleRecurrentLayerParams
              (this,(Arena *)0x0,false);
  }
  else {
    this = (SimpleRecurrentLayerParams *)
           AllocateAlignedWithHook
                     (arena,0x48,
                      (type_info *)&CoreML::Specification::SimpleRecurrentLayerParams::typeinfo);
    CoreML::Specification::SimpleRecurrentLayerParams::SimpleRecurrentLayerParams(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }